

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QUntypedBindable __thiscall QMetaProperty::bindable(QMetaProperty *this,QObject *object)

{
  QMetaObject *pQVar1;
  uint *puVar2;
  QDynamicMetaObjectData *pQVar3;
  QUntypedBindable QVar4;
  int iVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QUntypedPropertyData *local_28;
  QBindableInterface *pQStack_20;
  undefined1 *local_10;
  long local_8;
  
  local_10 = (undefined1 *)&local_28;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QUntypedPropertyData *)0x0;
  pQStack_20 = (QBindableInterface *)0x0;
  puVar2 = (this->mobj->d).data;
  iVar5 = 0;
  for (pQVar1 = (this->mobj->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
      pQVar1 = (pQVar1->d).superdata.direct) {
    iVar5 = iVar5 + (pQVar1->d).data[6];
  }
  uVar6 = iVar5 + ((int)((ulong)((long)(this->data).d - (long)puVar2) >> 2) - puVar2[7]) / 5;
  pQVar3 = ((object->d_ptr).d)->metaObject;
  if (pQVar3 == (QDynamicMetaObjectData *)0x0) {
    (*object->_vptr_QObject[2])(object,8,(ulong)uVar6,&local_10);
  }
  else {
    local_10 = (undefined1 *)&local_28;
    (*pQVar3->_vptr_QDynamicMetaObjectData[4])(pQVar3,object,8,(ulong)uVar6,&local_10);
  }
  QVar4.iface = pQStack_20;
  QVar4.data = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

QUntypedBindable QMetaProperty::bindable(QObject *object) const
{
    QUntypedBindable bindable;
    void * argv[1] { &bindable };
    mobj->metacall(object, QMetaObject::BindableProperty, data.index(mobj) + mobj->propertyOffset(), argv);
    return bindable;
}